

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall namedlabels::namedlabels(namedlabels *this,string *label_list)

{
  substring s;
  vw_exception *key;
  vector<substring,_std::allocator<substring>_> *ret;
  char *pcVar1;
  size_t __n;
  size_type sVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  string *pmessage;
  undefined8 uVar5;
  substring *key_00;
  ostream *in_RSI;
  vector<substring,_std::allocator<substring>_> *in_RDI;
  substring l_copy;
  size_t len;
  stringstream __msg;
  uint64_t id;
  uint64_t hash;
  substring *l;
  size_t k;
  substring ss;
  char *temp;
  unsigned_long *in_stack_fffffffffffffd48;
  void **hash_00;
  v_hashmap<substring,_unsigned_long> *in_stack_fffffffffffffd60;
  int plineNumber;
  vw_exception *this_00;
  vw_exception *ss_00;
  void *local_238;
  long local_230;
  size_t local_228;
  undefined1 local_219;
  stringstream local_1f8 [16];
  stringstream local_1e8 [256];
  size_t in_stack_ffffffffffffff18;
  uint64_t in_stack_ffffffffffffff28;
  substring *in_stack_ffffffffffffff30;
  v_hashmap<substring,_unsigned_long> *in_stack_ffffffffffffff38;
  ulong local_58;
  
  std::vector<substring,_std::allocator<substring>_>::vector
            ((vector<substring,_std::allocator<substring>_> *)0x13f426);
  v_hashmap<substring,_unsigned_long>::v_hashmap((v_hashmap<substring,_unsigned_long> *)0x13f439);
  std::__cxx11::string::length();
  key = (vw_exception *)calloc_or_throw<char>(in_stack_ffffffffffffff18);
  this_00 = key;
  ss_00 = key;
  ret = (vector<substring,_std::allocator<substring>_> *)std::__cxx11::string::c_str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __n = strlen(pcVar1);
  memcpy(this_00,ret,__n);
  std::__cxx11::string::length();
  s.end = (char *)in_RSI;
  s.begin = (char *)ss_00;
  tokenize<std::vector<substring,std::allocator<substring>>>
            ((char)((ulong)key >> 0x38),s,ret,SUB81((ulong)this_00 >> 0x38,0));
  sVar2 = std::vector<substring,_std::allocator<substring>_>::size(in_RDI);
  *(int *)&in_RDI[4].super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
           super__Vector_impl_data._M_finish = (int)sVar2;
  v_hashmap<substring,_unsigned_long>::delete_v((v_hashmap<substring,_unsigned_long> *)0x13f539);
  v_hashmap<substring,_unsigned_long>::init
            ((v_hashmap<substring,_unsigned_long> *)(in_RDI + 1),
             (EVP_PKEY_CTX *)
             (ulong)(*(int *)&in_RDI[4].super__Vector_base<substring,_std::allocator<substring>_>.
                              _M_impl.super__Vector_impl_data._M_finish * 4 + 1));
  local_58 = 0;
  while( true ) {
    if (*(uint *)&in_RDI[4].super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
                  super__Vector_impl_data._M_finish <= local_58) {
      return;
    }
    pvVar3 = std::vector<substring,_std::allocator<substring>_>::operator[](in_RDI,local_58);
    pcVar1 = (char *)uniform_hash(key,(size_t)ret,(uint64_t)this_00);
    puVar4 = v_hashmap<substring,_unsigned_long>::get
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff28);
    if (*puVar4 != 0) break;
    local_228 = (long)pvVar3->end - (long)pvVar3->begin;
    hash_00 = &local_238;
    key_00 = (substring *)calloc_or_throw<char>(in_stack_ffffffffffffff18);
    *hash_00 = key_00;
    local_230 = 0;
    memcpy(local_238,pvVar3->begin,local_228);
    local_230 = (long)local_238 + local_228;
    v_hashmap<substring,_unsigned_long>::put
              (in_stack_fffffffffffffd60,key_00,(uint64_t)hash_00,in_stack_fffffffffffffd48);
    local_58 = local_58 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f8);
  plineNumber = (int)((ulong)puVar4 >> 0x20);
  pmessage = (string *)
             std::operator<<((ostream *)(local_1f8 + 0x10),
                             "error: label dictionary initialized with multiple occurances of: ");
  ::operator<<(in_RSI,(substring *)ss_00);
  local_219 = 1;
  uVar5 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception(this_00,pcVar1,plineNumber,pmessage);
  local_219 = 0;
  __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

namedlabels(std::string label_list)
  {
    char* temp = calloc_or_throw<char>(1 + label_list.length());
    memcpy(temp, label_list.c_str(), strlen(label_list.c_str()));
    substring ss = {temp, nullptr};
    ss.end = ss.begin + label_list.length();
    tokenize(',', ss, id2name);

    K = (uint32_t)id2name.size();
    name2id.delete_v();  // delete automatically allocated vector.
    name2id.init(4 * K + 1, 0, substring_equal);
    for (size_t k = 0; k < K; k++)
    {
      substring& l = id2name[k];
      uint64_t hash = uniform_hash((unsigned char*)l.begin, l.end - l.begin, 378401);
      uint64_t id = name2id.get(l, hash);
      if (id != 0)  // TODO: memory leak: char* temp
        THROW("error: label dictionary initialized with multiple occurances of: " << l);
      size_t len = l.end - l.begin;
      substring l_copy = {calloc_or_throw<char>(len), nullptr};
      memcpy(l_copy.begin, l.begin, len * sizeof(char));
      l_copy.end = l_copy.begin + len;
      name2id.put(l_copy, hash, k + 1);
    }
  }